

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void arima_exec(arima_object obj,double *inp)

{
  int q;
  int d;
  int N;
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  iVar2 = obj->p;
  lVar5 = (long)iVar2;
  q = obj->q;
  lVar7 = (long)q;
  d = obj->d;
  lVar6 = (long)d;
  N = obj->N;
  lVar4 = (long)N;
  iVar1 = obj->method;
  if (iVar1 == 2) {
    dVar8 = macheps();
    piVar3 = &obj[1].N + lVar5 * 2;
    iVar2 = nlalsm(inp,obj->N,obj->p,obj->d,obj->q,(double *)(obj + 1),(double *)piVar3,obj->M,
                   &obj->mean,&obj->var,dVar8,(double *)(piVar3 + lVar7 * 2 + (lVar4 - lVar6) * 2),
                   (double *)(piVar3 + lVar7 * 2));
    obj->retval = iVar2;
  }
  else if (iVar1 == 1) {
    piVar3 = &obj[1].N + lVar5 * 2;
    iVar2 = css(inp,N,obj->optmethod,iVar2,d,q,(double *)(obj + 1),(double *)piVar3,&obj->mean,
                &obj->var,(double *)(piVar3 + lVar7 * 2),&obj->loglik,
                (double *)(piVar3 + lVar7 * 2 + (lVar4 - lVar6) * 2));
    obj->retval = iVar2;
    obj->loglik = (obj->loglik + obj->loglik + 1.0 + 1.8378762217451237) * (double)obj->Nused * -0.5
    ;
  }
  else if (iVar1 == 0) {
    piVar3 = &obj[1].N + lVar5 * 2;
    iVar2 = as154(inp,N,obj->optmethod,iVar2,d,q,(double *)(obj + 1),(double *)piVar3,&obj->mean,
                  &obj->var,(double *)(piVar3 + lVar7 * 2),&obj->loglik,
                  (double *)(piVar3 + lVar7 * 2 + (lVar4 - lVar6) * 2),obj->cssml);
    obj->retval = iVar2;
    dVar9 = (obj->loglik + obj->loglik + 1.0 + 1.8378762217451237) * (double)obj->Nused * -0.5;
    obj->loglik = dVar9;
    dVar8 = (double)(obj->q + obj->p + obj->M);
    obj->aic = ((dVar8 + dVar8) - (dVar9 + dVar9)) + 2.0;
  }
  return;
}

Assistant:

void arima_exec(arima_object obj, double *inp) {
	int p,q,d,N,M;
	double eps;

	p = obj->p;
	q = obj->q;
	d = obj->d;
	N = obj->N;

	if (obj->d > 0) {
		M = 0;
	}
	else {
		M = 1;
	}

	if (obj->method == 0) {
		obj->retval = as154(inp, obj->N, obj->optmethod, obj->p, obj->d, obj->q, obj->params, obj->params + p, &obj->mean, &obj->var, obj->params + p + q,&obj->loglik,
			obj->params + p + q + N - d,obj->cssml);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
		obj->aic = -2.0 * obj->loglik + 2.0 * (obj->p + obj->q + obj->M) + 2.0;
	}
	else if (obj->method == 1) {
		obj->retval = css(inp, obj->N, obj->optmethod, obj->p, obj->d, obj->q, obj->params, obj->params + p, &obj->mean, &obj->var, obj->params + p + q, &obj->loglik,
			obj->params + p + q + N - d);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
	}
	else if (obj->method == 2) {
		eps = macheps();
		obj->retval = nlalsm(inp, obj->N, obj->p, obj->d, obj->q, obj->params, obj->params + p, obj->M, &obj->mean, &obj->var, eps, obj->params + p + q + N - d, obj->params + p + q);
	}


}